

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O0

void __thiscall adiosStream::putADIOSArray(adiosStream *this,shared_ptr<VariableInfo> *ov)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  element_type *peVar4;
  long in_RDI;
  int *a_2;
  float *a_1;
  double *a;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x134aff
            );
  bVar1 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (bVar1) {
    std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x134b22);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x134b31);
    peVar4 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x134b51);
    adios2::Engine::Put<double>((string *)(in_RDI + 0x30),(double *)peVar4,(Mode)pcVar2);
  }
  else {
    std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x134b77);
    bVar1 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar1) {
      std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x134b9a);
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x134ba9);
      psVar3 = (string *)(in_RDI + 0x30);
      peVar4 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x134bc9);
      adios2::Engine::Put<float>(psVar3,(float *)peVar4,(Mode)pcVar2);
    }
    else {
      std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x134bec);
      bVar1 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar1) {
        std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x134c0f);
        pcVar2 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x134c1e);
        psVar3 = (string *)(in_RDI + 0x30);
        peVar4 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x134c3d);
        adios2::Engine::Put<int>(psVar3,(int *)peVar4,(Mode)pcVar2);
      }
    }
  }
  return;
}

Assistant:

void adiosStream::putADIOSArray(const std::shared_ptr<VariableInfo> ov)
{
    if (ov->type == "double")
    {
        const double *a = reinterpret_cast<const double *>(ov->data.data());
        engine.Put<double>(ov->name, a);
    }
    else if (ov->type == "float")
    {
        const float *a = reinterpret_cast<const float *>(ov->data.data());
        engine.Put<float>(ov->name, a);
    }
    else if (ov->type == "int")
    {
        const int *a = reinterpret_cast<const int *>(ov->data.data());
        engine.Put<int>(ov->name, a);
    }
}